

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsSetRuntimeDomWrapperTracingCallbacks
          (JsRuntimeHandle runtimeHandle,JsRef wrapperTracingState,
          JsDOMWrapperTracingCallback wrapperTracingCallback,
          JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback,
          JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)

{
  anon_class_40_5_3a846617 fn;
  JsErrorCode JVar1;
  JsDOMWrapperTracingEnterFinalPauseCallback *in_stack_ffffffffffffffa0;
  JsDOMWrapperTracingEnterFinalPauseCallback local_30;
  JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback_local;
  JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback_local;
  JsDOMWrapperTracingCallback wrapperTracingCallback_local;
  JsRef wrapperTracingState_local;
  JsRuntimeHandle runtimeHandle_local;
  
  fn.wrapperTracingState = &wrapperTracingDoneCallback_local;
  fn.runtimeHandle = &wrapperTracingCallback_local;
  fn.wrapperTracingCallback = &enterFinalPauseCallback_local;
  fn.wrapperTracingDoneCallback = (JsDOMWrapperTracingDoneCallback *)&local_30;
  fn.enterFinalPauseCallback = in_stack_ffffffffffffffa0;
  local_30 = enterFinalPauseCallback;
  enterFinalPauseCallback_local =
       (JsDOMWrapperTracingEnterFinalPauseCallback)wrapperTracingDoneCallback;
  wrapperTracingDoneCallback_local = (JsDOMWrapperTracingDoneCallback)wrapperTracingCallback;
  wrapperTracingCallback_local = (JsDOMWrapperTracingCallback)wrapperTracingState;
  wrapperTracingState_local = runtimeHandle;
  JVar1 = GlobalAPIWrapper_NoRecord<JsSetRuntimeDomWrapperTracingCallbacks::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API
JsSetRuntimeDomWrapperTracingCallbacks(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsRef wrapperTracingState,
    _In_ JsDOMWrapperTracingCallback wrapperTracingCallback,
    _In_ JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback,
    _In_ JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        recycler->SetDOMWrapperTracingCallback(wrapperTracingState, reinterpret_cast<DOMWrapperTracingCallback>(wrapperTracingCallback), reinterpret_cast<DOMWrapperTracingDoneCallback>(wrapperTracingDoneCallback), reinterpret_cast<DOMWrapperTracingEnterFinalPauseCallback>(enterFinalPauseCallback));
        return JsNoError;
    });
}